

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O0

int comex_fence_all(comex_group_t group)

{
  int *piVar1;
  int *notify;
  int count_after;
  int count_before;
  int p;
  int *in_stack_ffffffffffffffd8;
  int local_14;
  int local_10;
  int local_c;
  
  local_10 = 0;
  local_14 = 0;
  for (local_c = 0; local_c < l_state.size; local_c = local_c + 1) {
    if (fence_array[local_c] != '\0') {
      local_10 = local_10 + 1;
    }
  }
  if (local_10 != 0) {
    piVar1 = (int *)_my_malloc(0);
    if (piVar1 == (int *)0x0) {
      __assert_fail("notify",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                    ,0x422,"int comex_fence_all(comex_group_t)");
    }
    *piVar1 = local_10;
    for (local_c = 0; local_c < l_state.size; local_c = local_c + 1) {
      if ((local_c != l_state.rank) && (fence_array[local_c] != '\0')) {
        _send_fence_message((int)((ulong)piVar1 >> 0x20),in_stack_ffffffffffffffd8);
      }
    }
    while (0 < *piVar1) {
      comex_make_progress();
    }
    for (local_c = 0; local_c < l_state.size; local_c = local_c + 1) {
      if (fence_array[local_c] != '\0') {
        fence_array[local_c] = '\0';
        local_14 = local_14 + 1;
      }
    }
    if (local_10 != local_14) {
      __assert_fail("count_before == count_after",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                    ,0x43c,"int comex_fence_all(comex_group_t)");
    }
    _my_free((void *)0x1bfd4a);
  }
  return 0;
}

Assistant:

int comex_fence_all(comex_group_t group)
{
    int p = 0;
    int count_before = 0;
    int count_after = 0;
    int *notify = NULL;

#if DEBUG
    printf("[%d] comex_fence_all()\n", l_state.rank);
#endif

    /* count how many fence messagse to send */
    for (p=0; p<l_state.size; ++p) {
        if (fence_array[p]) {
            ++count_before;
        }
    }

    /* check for no outstanding put/get requests */
    if (0 == count_before) {
        return COMEX_SUCCESS;
    }

    /* we allocate the notifier on the heap in order to avoid reentry
     * into this function causing the same stack address to be reused */
    notify = _my_malloc(sizeof(int));
    assert(notify);
    *notify = count_before;

    /* optimize by only sending to procs which we have outstanding messages */
    for (p=0; p<l_state.size; ++p) {
        if (p == l_state.rank) {
            continue;
        }
        if (fence_array[p]) {
            _send_fence_message(p, notify);
        }
    }

    while (*notify > 0) {
        comex_make_progress();
#if DEBUG
        printf("[%d] are we stuck? notify=%d\n", l_state.rank, *notify);
#endif
    }

    for (p=0; p<l_state.size; ++p) {
        if (fence_array[p]) {
            fence_array[p] = 0;
            ++count_after;
        }
    }
    assert(count_before == count_after);

    _my_free(notify);

    return COMEX_SUCCESS;
}